

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int gen_iwmmxt_address(DisasContext_conflict1 *s,uint32_t insn,TCGv_i32 dest)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint reg;
  int arg2;
  TCGv_i32 arg;
  TCGv_i32 tmp;
  uint32_t offset;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 dest_local;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  reg = insn >> 0x10 & 0xf;
  arg = load_reg(s,reg);
  arg2 = (insn & 0xff) << ((byte)(insn >> 7) & 2);
  if ((insn & 0x1000000) == 0) {
    if ((insn & 0x200000) == 0) {
      if ((insn & 0x800000) == 0) {
        return 1;
      }
    }
    else {
      tcg_gen_mov_i32(tcg_ctx_00,dest,arg);
      if ((insn & 0x800000) == 0) {
        tcg_gen_addi_i32_aarch64(tcg_ctx_00,arg,arg,-arg2);
      }
      else {
        tcg_gen_addi_i32_aarch64(tcg_ctx_00,arg,arg,arg2);
      }
      store_reg(s,reg,arg);
    }
  }
  else {
    if ((insn & 0x800000) == 0) {
      tcg_gen_addi_i32_aarch64(tcg_ctx_00,arg,arg,-arg2);
    }
    else {
      tcg_gen_addi_i32_aarch64(tcg_ctx_00,arg,arg,arg2);
    }
    tcg_gen_mov_i32(tcg_ctx_00,dest,arg);
    if ((insn & 0x200000) == 0) {
      tcg_temp_free_i32(tcg_ctx_00,arg);
    }
    else {
      store_reg(s,reg,arg);
    }
  }
  return 0;
}

Assistant:

static inline int gen_iwmmxt_address(DisasContext *s, uint32_t insn,
                                     TCGv_i32 dest)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd;
    uint32_t offset;
    TCGv_i32 tmp;

    rd = (insn >> 16) & 0xf;
    tmp = load_reg(s, rd);

    offset = (insn & 0xff) << ((insn >> 7) & 2);
    if (insn & (1 << 24)) {
        /* Pre indexed */
        if (insn & (1 << 23))
            tcg_gen_addi_i32(tcg_ctx, tmp, tmp, offset);
        else
#ifdef _MSC_VER
            tcg_gen_addi_i32(tcg_ctx, tmp, tmp, 0 - offset);
#else
            tcg_gen_addi_i32(tcg_ctx, tmp, tmp, -offset);
#endif
        tcg_gen_mov_i32(tcg_ctx, dest, tmp);
        if (insn & (1 << 21))
            store_reg(s, rd, tmp);
        else
            tcg_temp_free_i32(tcg_ctx, tmp);
    } else if (insn & (1 << 21)) {
        /* Post indexed */
        tcg_gen_mov_i32(tcg_ctx, dest, tmp);
        if (insn & (1 << 23))
            tcg_gen_addi_i32(tcg_ctx, tmp, tmp, offset);
        else
#ifdef _MSC_VER
            tcg_gen_addi_i32(tcg_ctx, tmp, tmp, 0 - offset);
#else
            tcg_gen_addi_i32(tcg_ctx, tmp, tmp, -offset);
#endif
        store_reg(s, rd, tmp);
    } else if (!(insn & (1 << 23)))
        return 1;
    return 0;
}